

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteDatabase::Close(SQLiteDatabase *this)

{
  int iVar1;
  runtime_error *this_00;
  char **in_RCX;
  long in_FS_OFFSET;
  undefined8 local_48;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = sqlite3_close(this->m_db);
  if (iVar1 == 0) {
    this->m_db = (sqlite3 *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48 = sqlite3_errstr(iVar1);
    tinyformat::format<char_const*>
              (&local_40,(tinyformat *)"SQLiteDatabase: Failed to close database: %s\n",
               (char *)&local_48,in_RCX);
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Close()
{
    int res = sqlite3_close(m_db);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to close database: %s\n", sqlite3_errstr(res)));
    }
    m_db = nullptr;
}